

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O3

bool test_uintwide_t_edge::test_various_isolated_edge_cases(void)

{
  short *psVar1;
  short *psVar2;
  ushort uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  value_type_conflict3 vVar9;
  value_type_conflict3 vVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  value_type_conflict3 vVar13;
  value_type_conflict3 vVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  value_type_conflict3 vVar17;
  value_type_conflict3 vVar18;
  value_type_conflict3 vVar19;
  value_type_conflict3 vVar20;
  enable_if_t<std::is_integral<int>::value,_bool> eVar21;
  uintwide_t<64U,_unsigned_short,_void,_false> *puVar22;
  long lVar23;
  unsigned_long __value;
  enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short>_>
  *peVar24;
  enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short,_void,_true>_>
  *peVar25;
  enable_if_t<(std::is_integral<unsigned_int>::value_&&_(_std::is_signed<unsigned_int>::value)),_uintwide_t<256U,_unsigned_short,_void,_true>_>
  *peVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  _Adaptor<std::discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>,_float>
  __aurng;
  uint i_3;
  long in_R8;
  uint i;
  int iVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  float fVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ushort uVar43;
  local_uint64_type c_uint;
  local_uint64_type a_uint;
  local_uint64_type b_uint;
  local_uintwide_t_small_unsigned_type u_inf_ld;
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_> ul_neg;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  ul_ctrl;
  uintwide_t<256U,_unsigned_short,_void,_false> local_128;
  undefined1 local_108 [24];
  undefined8 uStack_f0;
  uintwide_t<256U,_unsigned_short,_void,_false> local_e8;
  float local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  double local_48;
  longdouble local_3c;
  
  local_108._0_2_ = 0;
  local_108._2_2_ = 0;
  local_108._4_2_ = 0;
  local_108._6_2_ = 0;
  uVar28 = 0xff00000004000000;
  lVar23 = 0;
  do {
    *(short *)(local_108 + lVar23) = (short)uVar28;
    if (uVar28 < 0x10000) break;
    uVar28 = uVar28 >> 0x10;
    bVar33 = lVar23 != 6;
    lVar23 = lVar23 + 2;
  } while (bVar33);
  uVar28 = 0x3000000000f;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[0] = 0xf;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[2] = 0x300;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  lVar23 = 6;
  do {
    if (lVar23 == -2) goto LAB_0011476a;
    uVar43 = *(ushort *)((long)local_e8.values.super_array<unsigned_short,_16UL>.elems + lVar23);
    uVar3 = *(ushort *)(local_108 + lVar23);
    lVar23 = lVar23 + -2;
  } while (uVar3 == uVar43);
  if (uVar3 < uVar43 || uVar3 == uVar43) {
    uVar5._0_2_ = 0xf;
    uVar5._2_2_ = 0;
    uVar5._4_2_ = 0x300;
    uVar5._6_2_ = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems._0_4_ = SUB84(local_108._0_8_,0);
    local_e8.values.super_array<unsigned_short,_16UL>.elems._4_4_ = SUB84(local_108._0_8_,4);
    uVar32 = 0xff00000004000000;
    local_108._0_8_ = uVar5;
  }
  else {
LAB_0011476a:
    uVar32 = 0x3000000000f;
    uVar28 = 0xff00000004000000;
  }
  local_128.values.super_array<unsigned_short,_16UL>.elems[0] =
       (value_type_conflict3)local_108._0_8_;
  local_128.values.super_array<unsigned_short,_16UL>.elems[1] = SUB82(local_108._0_8_,2);
  local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = SUB84(local_108._0_8_,4);
  puVar22 = math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>::operator/=
                      ((uintwide_t<64U,_unsigned_short,_void,_false> *)&local_128,
                       (uintwide_t<64U,_unsigned_short,_void,_false> *)&local_e8);
  uVar5 = *(undefined8 *)(puVar22->values).super_array<unsigned_short,_4UL>.elems;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0] = (value_type_conflict3)uVar5;
  local_128.values.super_array<unsigned_short,_16UL>.elems[1] =
       (value_type_conflict3)((ulong)uVar5 >> 0x10);
  local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = SUB84((ulong)uVar5 >> 0x20,0);
  lVar39 = 0;
  lVar40 = 0x10;
  lVar23 = 0;
  uVar41 = 0;
  uVar42 = 0;
  do {
    uVar4 = *(undefined4 *)(local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
    uVar43 = (ushort)((uint)uVar4 >> 0x10);
    uVar41 = uVar41 | ((ulong)CONCAT24(uVar43,uVar4) & 0xffff) << lVar39;
    uVar42 = uVar42 | (ulong)uVar43 << lVar40;
    lVar23 = lVar23 + 2;
    lVar39 = lVar39 + 0x20;
    lVar40 = lVar40 + 0x20;
  } while (lVar23 != 4);
  local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0xffff;
  lVar23 = 0x1e;
  do {
    lVar39 = lVar23;
    if (lVar39 == -2) break;
    lVar23 = lVar39 + -2;
  } while (*(short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar39) ==
           *(short *)(local_108 + lVar39));
  stack0xffffffffffffff08 = (undefined1  [16])0x0;
  local_108._0_16_ = (undefined1  [16])0x0;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<int>
            (&local_128,0,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  lVar23 = 0x1e;
  do {
    lVar40 = lVar23;
    if (lVar40 == -2) break;
    lVar23 = lVar40 + -2;
  } while (*(short *)(local_108 + lVar40) ==
           *(short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar40));
  local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0xffff;
  lVar23 = 0x1e;
  do {
    lVar29 = lVar23;
    if (lVar29 == -2) break;
    lVar23 = lVar29 + -2;
  } while (*(short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar29) ==
           *(short *)(local_108 + lVar29));
  local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0xffff;
  local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0xffff;
  uStack_f0._0_4_ = 0xffffffff;
  local_108._16_8_ = 0xffffffffffffffff;
  uStack_f0._4_4_ = 0xffffffff;
  local_108._8_4_ = 0xffffffff;
  local_108._0_8_ = 0xffffffffffffffff;
  local_108._12_4_ = 0xffffffff;
  lVar23 = 0x1e;
  do {
    lVar30 = lVar23;
    if (lVar30 == -2) break;
    lVar23 = lVar30 + -2;
  } while (*(short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar30) ==
           *(short *)(local_108 + lVar30));
  bVar33 = (((lVar39 == -2 && lVar40 == -2) && lVar29 == -2) &&
           (uVar28 / uVar32 == 0x54ffff && (uVar42 | uVar41) == 0x54ffff)) && lVar30 == -2;
  iVar31 = 0;
LAB_0011492f:
  __value = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>::seed
            ((subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL> *)&eng_flt,__value);
  _DAT_0020b4e8 = 0;
  fVar38 = std::
           generate_canonical<float,24ul,std::discard_block_engine<std::subtract_with_carry_engine<unsigned_long,48ul,5ul,12ul>,389ul,11ul>>
                     ((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                       *)&eng_flt);
  local_bc = (fVar38 * 0.029999971 + 1.01) * INFINITY;
  fVar38 = std::
           generate_canonical<float,24ul,std::discard_block_engine<std::subtract_with_carry_engine<unsigned_long,48ul,5ul,12ul>,389ul,11ul>>
                     ((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                       *)&eng_flt);
  local_48 = (double)(fVar38 * 0.029999971 + 1.01) * INFINITY;
  fVar38 = std::
           generate_canonical<float,24ul,std::discard_block_engine<std::subtract_with_carry_engine<unsigned_long,48ul,5ul,12ul>,389ul,11ul>>
                     ((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                       *)&eng_flt);
  local_8c = fVar38 * 0.029999971 + 1.01;
  local_3c = (longdouble)local_8c * (longdouble)INFINITY;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<float,_nullptr>
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_108,local_bc);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<double,_nullptr>
            (&local_e8,local_48);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
  uintwide_t<long_double,_nullptr>
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_b8,local_3c);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<int>
            (&local_128,0,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  lVar23 = 0x1e;
  do {
    if (lVar23 == -2) {
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<int>
                (&local_128,0,
                 (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
      lVar23 = 0x1e;
      goto LAB_00114a4e;
    }
    psVar1 = (short *)(local_108 + lVar23);
    psVar2 = (short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
    lVar23 = lVar23 + -2;
  } while (*psVar1 == *psVar2);
  goto LAB_00114a96;
  while (psVar1 = (short *)((long)local_e8.values.super_array<unsigned_short,_16UL>.elems + lVar23),
        psVar2 = (short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23),
        lVar23 = lVar23 + -2, *psVar1 == *psVar2) {
LAB_00114a4e:
    if (lVar23 == -2) {
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<int>
                (&local_128,0,
                 (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
      lVar23 = 0x1e;
      goto LAB_00114a7a;
    }
  }
  goto LAB_00114a96;
  while (psVar2 = (short *)(local_b8 + lVar23),
        psVar1 = (short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23),
        lVar23 = lVar23 + -2, *psVar2 == *psVar1) {
LAB_00114a7a:
    if (lVar23 == -2) goto LAB_00114a98;
  }
LAB_00114a96:
  bVar33 = false;
LAB_00114a98:
  iVar31 = iVar31 + 1;
  if (iVar31 == 0x10) goto code_r0x00114aa5;
  goto LAB_0011492f;
code_r0x00114aa5:
  iVar31 = 0;
  do {
    uVar43 = 0;
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_108,
               (test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
    local_128.values.super_array<unsigned_short,_16UL>.elems[8] = local_108._16_2_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[8] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[8];
    local_128.values.super_array<unsigned_short,_16UL>.elems[9] = local_108._18_2_;
    vVar13 = local_128.values.super_array<unsigned_short,_16UL>.elems[9];
    local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_108._20_4_;
    uVar15 = local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_;
    local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_108._24_4_;
    uVar16 = local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_108._28_2_;
    vVar14 = local_128.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_108._30_2_;
    vVar17 = local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_128.values.super_array<unsigned_short,_16UL>.elems[0] = local_108._0_2_;
    vVar9 = local_128.values.super_array<unsigned_short,_16UL>.elems[0];
    local_128.values.super_array<unsigned_short,_16UL>.elems[1] = local_108._2_2_;
    vVar10 = local_128.values.super_array<unsigned_short,_16UL>.elems[1];
    local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_108._4_4_;
    uVar4 = local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_;
    local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_108._8_4_;
    uVar11 = local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_;
    local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_108._12_4_;
    uVar12 = local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_;
    lVar23 = 0x1e;
    do {
      uVar3 = *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23) =
           uVar43 | uVar3 >> 4;
      uVar43 = uVar3 << 0xc;
      lVar23 = lVar23 + -2;
    } while (lVar23 != -2);
    local_e8.values.super_array<unsigned_short,_16UL>.elems._0_4_ = local_108._0_4_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems._18_4_ = local_108._18_4_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xb] = local_108._22_2_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xc] = local_108._24_2_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems._26_4_ =
         SUB64(CONCAT24(local_128.values.super_array<unsigned_short,_16UL>.elems[0xe],
                        local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_) >> 0x10,0);
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xf] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[2] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[2];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[3] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[3];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[4] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[4];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[5] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[5];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[6] = local_108._12_2_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[7] = local_108._14_2_;
    lVar23 = 0x1e;
    uVar43 = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar14;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar17;
    do {
      uVar3 = *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23) =
           uVar43 | uVar3 >> 4;
      uVar43 = uVar3 << 0xc;
      lVar23 = lVar23 + -2;
    } while (lVar23 != -2);
    local_a8._12_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_a8._8_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xc];
    local_a8._10_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xd];
    local_a8._14_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_a8._0_8_ = local_108._16_8_;
    local_b8 = local_108._0_16_;
    uVar43 = 0;
    lVar23 = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar14;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar17;
    do {
      uVar3 = *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23) =
           uVar43 | uVar3 << 4;
      lVar23 = lVar23 + 2;
      uVar43 = uVar3 >> 0xc;
    } while (lVar23 != 0x20);
    local_88 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                        CONCAT22(local_128.values.super_array<unsigned_short,_16UL>.elems[1],
                                 local_128.values.super_array<unsigned_short,_16UL>.elems[0]));
    uStack_80 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_,
                         local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_);
    local_78 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_,
                        CONCAT22(local_128.values.super_array<unsigned_short,_16UL>.elems[9],
                                 local_128.values.super_array<unsigned_short,_16UL>.elems[8]));
    uStack_70 = CONCAT26(local_128.values.super_array<unsigned_short,_16UL>.elems[0xf],
                         CONCAT24(local_128.values.super_array<unsigned_short,_16UL>.elems[0xe],
                                  local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_));
    uVar43 = 0;
    lVar23 = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0] = vVar9;
    local_128.values.super_array<unsigned_short,_16UL>.elems[1] = vVar10;
    local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = uVar4;
    local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ = uVar11;
    local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ = uVar12;
    local_128.values.super_array<unsigned_short,_16UL>.elems[8] =
         local_e8.values.super_array<unsigned_short,_16UL>.elems[8];
    local_128.values.super_array<unsigned_short,_16UL>.elems[9] = vVar13;
    local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ = uVar15;
    local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ = uVar16;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar14;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar17;
    do {
      uVar3 = *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23) =
           uVar43 | uVar3 << 4;
      lVar23 = lVar23 + 2;
      uVar43 = uVar3 >> 0xc;
    } while (lVar23 != 0x20);
    local_68 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                        CONCAT22(local_128.values.super_array<unsigned_short,_16UL>.elems[1],
                                 local_128.values.super_array<unsigned_short,_16UL>.elems[0]));
    uStack_60 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_,
                         local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_);
    local_58 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_,
                        CONCAT22(local_128.values.super_array<unsigned_short,_16UL>.elems[9],
                                 local_128.values.super_array<unsigned_short,_16UL>.elems[8]));
    uStack_50 = CONCAT26(local_128.values.super_array<unsigned_short,_16UL>.elems[0xf],
                         CONCAT24(local_128.values.super_array<unsigned_short,_16UL>.elems[0xe],
                                  local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_));
    lVar23 = 0x1e;
    do {
      lVar39 = lVar23;
      if (lVar39 == -2) break;
      lVar23 = lVar39 + -2;
    } while (*(short *)((long)&local_88 + lVar39) == *(short *)((long)&local_68 + lVar39));
    lVar23 = 0x1e;
    do {
      if (lVar23 == -2) goto LAB_00114c68;
      psVar1 = (short *)((long)local_e8.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      psVar2 = (short *)(local_b8 + lVar23);
      lVar23 = lVar23 + -2;
    } while (*psVar1 == *psVar2);
    bVar33 = false;
LAB_00114c68:
    bVar33 = (bool)(lVar39 == -2 & bVar33);
    iVar31 = iVar31 + 1;
  } while (iVar31 != 0x100);
  iVar31 = 0;
  do {
    local_b8 = local_108._0_16_;
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_108,(test_uintwide_t_edge *)0x0
               ,false,0x4c,(int)in_R8);
    local_128.values.super_array<unsigned_short,_16UL>.elems[8] = local_108._16_2_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[8] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[8];
    local_128.values.super_array<unsigned_short,_16UL>.elems[9] = local_108._18_2_;
    vVar13 = local_128.values.super_array<unsigned_short,_16UL>.elems[9];
    local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_108._20_4_;
    uVar15 = local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_;
    local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_108._24_4_;
    uVar16 = local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_108._28_2_;
    vVar14 = local_128.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_108._30_2_;
    vVar17 = local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_128.values.super_array<unsigned_short,_16UL>.elems[0] = local_108._0_2_;
    vVar9 = local_128.values.super_array<unsigned_short,_16UL>.elems[0];
    local_128.values.super_array<unsigned_short,_16UL>.elems[1] = local_108._2_2_;
    vVar10 = local_128.values.super_array<unsigned_short,_16UL>.elems[1];
    local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_108._4_4_;
    uVar4 = local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_;
    local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_108._8_4_;
    uVar11 = local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_;
    local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_108._12_4_;
    uVar12 = local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_;
    uVar27 = (uint)(int)(short)local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] >> 0xf
             & 0xf000;
    lVar23 = 0x1e;
    do {
      uVar43 = *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23) =
           (ushort)uVar27 | uVar43 >> 4;
      vVar18 = local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
      uVar27 = (uint)uVar43 << 0xc;
      lVar23 = lVar23 + -2;
    } while (lVar23 != -2);
    local_e8.values.super_array<unsigned_short,_16UL>.elems._0_4_ = local_108._0_4_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems._18_4_ = local_108._18_4_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xb] = local_108._22_2_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xc] = local_108._24_2_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems._26_4_ =
         SUB64(CONCAT24(local_128.values.super_array<unsigned_short,_16UL>.elems[0xe],
                        local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_) >> 0x10,0);
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xf] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[2] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[2];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[3] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[3];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[4] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[4];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[5] =
         local_128.values.super_array<unsigned_short,_16UL>.elems[5];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[6] = local_108._12_2_;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[7] = local_108._14_2_;
    uVar27 = (uint)(int)(short)vVar17 >> 0xf & 0xf000;
    lVar23 = 0x1e;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar14;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar17;
    do {
      uVar43 = *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23) =
           (ushort)uVar27 | uVar43 >> 4;
      vVar19 = local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
      uVar27 = (uint)uVar43 << 0xc;
      lVar23 = lVar23 + -2;
    } while (lVar23 != -2);
    local_a8._12_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xe];
    local_a8._8_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xc];
    local_a8._10_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xd];
    local_a8._14_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_a8._0_8_ = local_108._16_8_;
    local_b8 = local_108._0_16_;
    uVar43 = 0;
    lVar23 = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar14;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar17;
    do {
      uVar3 = *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23) =
           uVar43 | uVar3 << 4;
      vVar20 = local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
      lVar23 = lVar23 + 2;
      uVar43 = uVar3 >> 0xc;
    } while (lVar23 != 0x20);
    local_88 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                        CONCAT22(local_128.values.super_array<unsigned_short,_16UL>.elems[1],
                                 local_128.values.super_array<unsigned_short,_16UL>.elems[0]));
    uStack_80 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_,
                         local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_);
    local_78 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_,
                        CONCAT22(local_128.values.super_array<unsigned_short,_16UL>.elems[9],
                                 local_128.values.super_array<unsigned_short,_16UL>.elems[8]));
    uStack_70 = CONCAT26(local_128.values.super_array<unsigned_short,_16UL>.elems[0xf],
                         CONCAT24(local_128.values.super_array<unsigned_short,_16UL>.elems[0xe],
                                  local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_));
    uVar43 = 0;
    lVar23 = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0] = vVar9;
    local_128.values.super_array<unsigned_short,_16UL>.elems[1] = vVar10;
    local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = uVar4;
    local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ = uVar11;
    local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ = uVar12;
    local_128.values.super_array<unsigned_short,_16UL>.elems[8] =
         local_e8.values.super_array<unsigned_short,_16UL>.elems[8];
    local_128.values.super_array<unsigned_short,_16UL>.elems[9] = vVar13;
    local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ = uVar15;
    local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ = uVar16;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar14;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar17;
    do {
      uVar3 = *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      *(ushort *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23) =
           uVar43 | uVar3 << 4;
      lVar23 = lVar23 + 2;
      uVar43 = uVar3 >> 0xc;
    } while (lVar23 != 0x20);
    local_68 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                        CONCAT22(local_128.values.super_array<unsigned_short,_16UL>.elems[1],
                                 local_128.values.super_array<unsigned_short,_16UL>.elems[0]));
    uStack_60 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_,
                         local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_);
    local_58 = CONCAT44(local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_,
                        CONCAT22(local_128.values.super_array<unsigned_short,_16UL>.elems[9],
                                 local_128.values.super_array<unsigned_short,_16UL>.elems[8]));
    uStack_50 = CONCAT26(local_128.values.super_array<unsigned_short,_16UL>.elems[0xf],
                         CONCAT24(local_128.values.super_array<unsigned_short,_16UL>.elems[0xe],
                                  local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_));
    if ((short)(vVar20 ^ local_128.values.super_array<unsigned_short,_16UL>.elems[0xf]) < 0) {
      bVar34 = false;
    }
    else {
      lVar23 = 0x1e;
      do {
        bVar34 = lVar23 == -2;
        if (bVar34) break;
        psVar1 = (short *)((long)&local_88 + lVar23);
        psVar2 = (short *)((long)&local_68 + lVar23);
        lVar23 = lVar23 + -2;
      } while (*psVar1 == *psVar2);
    }
    if (-1 < (short)(vVar18 ^ vVar19)) {
      lVar23 = 0x1e;
      do {
        if (lVar23 == -2) goto LAB_00114e86;
        psVar1 = (short *)((long)local_e8.values.super_array<unsigned_short,_16UL>.elems + lVar23);
        psVar2 = (short *)(local_b8 + lVar23);
        lVar23 = lVar23 + -2;
      } while (*psVar1 == *psVar2);
    }
    bVar33 = false;
LAB_00114e86:
    bVar33 = (bool)(bVar34 & bVar33);
    iVar31 = iVar31 + 1;
  } while (iVar31 != 0x100);
  local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 1;
  local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  stack0xffffffffffffff08 = (undefined1  [16])0x0;
  local_108._0_16_ = (undefined1  [16])0x0;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
            (&local_128,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_108);
  lVar23 = 0x1e;
  do {
    lVar39 = lVar23;
    if (lVar39 == -2) break;
    lVar23 = lVar39 + -2;
  } while (*(short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar39) ==
           *(short *)(local_108 + lVar39));
  local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 1;
  local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  stack0xffffffffffffff08 = (undefined1  [16])0x0;
  local_108._0_16_ = (undefined1  [16])0x0;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
            (&local_128,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_108);
  uStack_f0._0_4_ = 0xffffffff;
  local_108._16_8_ = 0xffffffffffffffff;
  uStack_f0._4_4_ = 0xffffffff;
  local_108._8_4_ = 0xffffffff;
  local_108._0_8_ = 0xffffffffffffffff;
  local_108._12_4_ = 0xffffffff;
  lVar23 = 0x1e;
  do {
    lVar40 = lVar23;
    if (lVar40 == -2) break;
    lVar23 = lVar40 + -2;
  } while (*(short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar40) ==
           *(short *)(local_108 + lVar40));
  bVar33 = (bool)((lVar39 == -2 && lVar40 == -2) & bVar33);
  iVar31 = 0;
  do {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              (&local_128,(test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
              (&local_128,&zero_as_small_unsigned_type::local_zero_as_small_unsigned_type);
    uStack_f0._0_4_ = 0xffffffff;
    local_108._16_8_ = 0xffffffffffffffff;
    uStack_f0._4_4_ = 0xffffffff;
    local_108._8_4_ = 0xffffffff;
    local_108._0_8_ = 0xffffffffffffffff;
    local_108._12_4_ = 0xffffffff;
    lVar23 = 0x1e;
    do {
      if (lVar23 == -2) goto LAB_00114fbb;
      psVar1 = (short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      psVar2 = (short *)(local_108 + lVar23);
      lVar23 = lVar23 + -2;
    } while (*psVar1 == *psVar2);
    bVar33 = false;
LAB_00114fbb:
    iVar31 = iVar31 + 1;
  } while (iVar31 != 0x100);
  iVar31 = 0;
  do {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              (&local_128,(test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
    local_108._2_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[1];
    local_108._0_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0];
    local_108._4_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[2];
    local_108._6_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[3];
    local_108._12_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[6];
    local_108._14_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[7];
    local_108._8_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[4];
    local_108._10_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[5];
    local_108._18_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[9];
    local_108._16_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[8];
    local_108._20_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[10];
    local_108._22_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xb];
    uStack_f0._4_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xe];
    uStack_f0._0_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xc];
    uStack_f0._2_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xd];
    uStack_f0._6_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
    local_e8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator/=
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_108,
               (uintwide_t<256U,_unsigned_short,_void,_true> *)&local_e8);
    local_e8.values.super_array<unsigned_short,_16UL>.elems[8] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[9] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[10] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[1] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[2] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[3] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[4] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[5] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[6] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[7] = 0xffff;
    local_e8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0x7fff;
    if (-1 < (short)uStack_f0._6_2_) {
      lVar23 = 0x1e;
      do {
        if (lVar23 == -2) goto LAB_0011505c;
        psVar1 = (short *)(local_108 + lVar23);
        psVar2 = (short *)((long)local_e8.values.super_array<unsigned_short,_16UL>.elems + lVar23);
        lVar23 = lVar23 + -2;
      } while (*psVar1 == *psVar2);
    }
    bVar33 = false;
LAB_0011505c:
    iVar31 = iVar31 + 1;
  } while (iVar31 != 0x100);
  local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
            (&local_128,&zero_as_small_unsigned_type::local_zero_as_small_unsigned_type);
  uStack_f0._0_4_ = 0xffffffff;
  local_108._16_8_ = 0xffffffffffffffff;
  uStack_f0._4_4_ = 0xffffffff;
  local_108._8_4_ = 0xffffffff;
  local_108._0_8_ = 0xffffffffffffffff;
  local_108._12_4_ = 0xffffffff;
  lVar23 = 0x1e;
  do {
    if (lVar23 == -2) goto LAB_001150bb;
    psVar1 = (short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
    psVar2 = (short *)(local_108 + lVar23);
    lVar23 = lVar23 + -2;
  } while (*psVar1 == *psVar2);
  bVar33 = false;
LAB_001150bb:
  iVar31 = 0;
  do {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              (&local_e8,(test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
    stack0xffffffffffffff08 = (undefined1  [16])0x0;
    local_108._0_16_ = (undefined1  [16])0x0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
    local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::eval_divide_knuth
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_108,&local_e8,&local_128);
    local_108._2_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[1];
    local_108._0_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[0];
    local_108._4_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[2];
    local_108._6_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[3];
    local_108._12_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[6];
    local_108._14_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[7];
    local_108._8_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[4];
    local_108._10_2_ = local_128.values.super_array<unsigned_short,_16UL>.elems[5];
    lVar23 = 0x1e;
    do {
      if (lVar23 == -2) goto LAB_00115148;
      psVar2 = (short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
      psVar1 = (short *)((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.values
                               .super_array<unsigned_short,_16UL>.elems + lVar23);
      lVar23 = lVar23 + -2;
    } while (*psVar2 == *psVar1);
    bVar33 = false;
LAB_00115148:
    iVar31 = iVar31 + 1;
  } while (iVar31 != 0x100);
  stack0xffffffffffffff08 = (undefined1  [16])0x0;
  local_108._0_16_ = (undefined1  [16])0x0;
  bVar34 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::rd_string
                     ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_108,
                      "10000000000000000000000000000000000000000",0xffffffffffffffff,0);
  if (!bVar34) {
    uStack_f0._0_4_ = 0xffffffff;
    local_108._16_8_ = 0xffffffffffffffff;
    uStack_f0._4_4_ = 0xffffffff;
    local_108._8_4_ = 0xffffffff;
    local_108._0_8_ = 0xffffffffffffffff;
    local_108._12_4_ = 0xffffffff;
  }
  local_e8.values.super_array<unsigned_short,_16UL>.elems[8] = local_108._16_2_;
  local_e8.values.super_array<unsigned_short,_16UL>.elems._18_4_ = local_108._18_4_;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[0xb] = local_108._22_2_;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[0xc] = local_108._24_2_;
  local_e8.values.super_array<unsigned_short,_16UL>.elems._26_4_ = local_108._26_4_;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_108._30_2_;
  local_e8.values.super_array<unsigned_short,_16UL>.elems._0_4_ = local_108._0_4_;
  local_e8.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_108._4_4_;
  local_e8.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_108._8_4_;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[6] = local_108._12_2_;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[7] = local_108._14_2_;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  bVar34 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::rd_string
                     ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_b8,
                      "10000000000000000000000000000000000000000",0xffffffffffffffff,0);
  if (!bVar34) {
    local_a8._8_4_ = 0xffffffff;
    local_a8._0_8_ = 0xffffffffffffffff;
    local_a8._12_4_ = 0xffffffff;
    local_b8._8_4_ = 0xffffffff;
    local_b8._0_8_ = 0xffffffffffffffff;
    local_b8._12_4_ = 0xffffffff;
  }
  local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::eval_divide_knuth
            (&local_e8,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_b8,&local_128);
  local_e8.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_e8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<int>
            (&local_128,0,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  lVar23 = 0x1e;
  do {
    if (lVar23 == -2) {
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<int>
                (&local_128,0,
                 (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
      lVar23 = 0x1e;
      goto LAB_00115262;
    }
    psVar1 = (short *)((long)local_e8.values.super_array<unsigned_short,_16UL>.elems + lVar23);
    psVar2 = (short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23);
    lVar23 = lVar23 + -2;
  } while (*psVar1 == *psVar2);
  goto LAB_0011527b;
  while (psVar1 = (short *)((long)local_e8.values.super_array<unsigned_short,_16UL>.elems + lVar23),
        psVar2 = (short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23),
        lVar23 = lVar23 + -2, *psVar1 == *psVar2) {
LAB_00115262:
    if (lVar23 == -2) goto LAB_0011527d;
  }
LAB_0011527b:
  bVar33 = false;
LAB_0011527d:
  iVar31 = 0;
  do {
    uVar27 = 300;
    do {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_108,
                 (test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
      local_128.values.super_array<unsigned_short,_16UL>.elems[8] = local_108._16_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[9] = local_108._18_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_108._20_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_108._24_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_108._28_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_108._30_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0] = local_108._0_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[1] = local_108._2_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_108._4_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_108._8_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_108._12_4_;
      peVar24 = math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::operator<<=
                          ((uintwide_t<256u,unsigned_short,void,false> *)&local_128,uVar27);
      uVar5 = *(undefined8 *)(peVar24->values).super_array<unsigned_short,_16UL>.elems;
      uVar6 = *(undefined8 *)((peVar24->values).super_array<unsigned_short,_16UL>.elems + 4);
      uVar7 = *(undefined8 *)((peVar24->values).super_array<unsigned_short,_16UL>.elems + 8);
      uVar8 = *(undefined8 *)((peVar24->values).super_array<unsigned_short,_16UL>.elems + 0xc);
      local_e8.values.super_array<unsigned_short,_16UL>.elems._0_4_ = SUB84(uVar5,0);
      local_e8.values.super_array<unsigned_short,_16UL>.elems._4_4_ = SUB84((ulong)uVar5 >> 0x20,0);
      local_e8.values.super_array<unsigned_short,_16UL>.elems._8_4_ = SUB84(uVar6,0);
      local_e8.values.super_array<unsigned_short,_16UL>.elems[6] =
           (value_type_conflict3)((ulong)uVar6 >> 0x20);
      local_e8.values.super_array<unsigned_short,_16UL>.elems[7] =
           (value_type_conflict3)((ulong)uVar6 >> 0x30);
      local_e8.values.super_array<unsigned_short,_16UL>.elems[8] = (value_type_conflict3)uVar7;
      local_e8.values.super_array<unsigned_short,_16UL>.elems._18_4_ = SUB84((ulong)uVar7 >> 0x10,0)
      ;
      local_e8.values.super_array<unsigned_short,_16UL>.elems[0xb] =
           (value_type_conflict3)((ulong)uVar7 >> 0x30);
      local_e8.values.super_array<unsigned_short,_16UL>.elems[0xc] = (value_type_conflict3)uVar8;
      local_e8.values.super_array<unsigned_short,_16UL>.elems._26_4_ = SUB84((ulong)uVar8 >> 0x10,0)
      ;
      local_e8.values.super_array<unsigned_short,_16UL>.elems[0xf] =
           (value_type_conflict3)((ulong)uVar8 >> 0x30);
      local_a8 = ZEXT816(0);
      local_b8 = ZEXT816(0);
      local_128.values.super_array<unsigned_short,_16UL>.elems[8] = local_108._16_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[9] = local_108._18_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_108._20_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_108._24_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_108._28_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_108._30_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0] = local_108._0_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[1] = local_108._2_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_108._4_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_108._8_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_108._12_4_;
      peVar24 = math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::operator>>=
                          ((uintwide_t<256u,unsigned_short,void,false> *)&local_128,uVar27);
      local_88 = *(undefined8 *)(peVar24->values).super_array<unsigned_short,_16UL>.elems;
      uStack_80 = *(undefined8 *)((peVar24->values).super_array<unsigned_short,_16UL>.elems + 4);
      local_78 = *(undefined8 *)((peVar24->values).super_array<unsigned_short,_16UL>.elems + 8);
      uStack_70 = *(undefined8 *)((peVar24->values).super_array<unsigned_short,_16UL>.elems + 0xc);
      local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
      lVar23 = 0x1e;
      do {
        lVar39 = lVar23;
        if (lVar39 == -2) break;
        lVar23 = lVar39 + -2;
      } while (*(short *)((long)local_e8.values.super_array<unsigned_short,_16UL>.elems + lVar39) ==
               *(short *)((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.
                                values.super_array<unsigned_short,_16UL>.elems + lVar39));
      lVar23 = 0x1e;
      do {
        lVar40 = lVar23;
        if (lVar40 == -2) break;
        lVar23 = lVar40 + -2;
      } while (*(short *)(local_b8 + lVar40) ==
               *(short *)((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.
                                values.super_array<unsigned_short,_16UL>.elems + lVar40));
      lVar23 = 0x1e;
      do {
        lVar29 = lVar23;
        if (lVar29 == -2) break;
        lVar23 = lVar29 + -2;
      } while (*(short *)((long)&local_88 + lVar29) ==
               *(short *)((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.
                                values.super_array<unsigned_short,_16UL>.elems + lVar29));
      lVar23 = 0x1e;
      do {
        lVar30 = lVar23;
        if (lVar30 == -2) break;
        lVar23 = lVar30 + -2;
      } while (*(short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar30)
               == *(short *)((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.
                                   values.super_array<unsigned_short,_16UL>.elems + lVar30));
      bVar33 = (bool)(bVar33 & ((lVar39 == -2 && lVar40 == -2) && lVar29 == -2) & lVar30 == -2);
      bVar34 = uVar27 < 0x76c;
      uVar27 = uVar27 + 100;
    } while (bVar34);
    iVar31 = iVar31 + 1;
  } while (iVar31 != 0x100);
  local_bc = 0.0;
  do {
    uVar27 = 300;
    do {
      bVar34 = false;
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_108,
                 (test_uintwide_t_edge *)0x0,false,0x4c,(int)in_R8);
      local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
      local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
      eVar21 = math::wide_integer::operator<
                         ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_108,
                          (int *)&local_128);
      local_128.values.super_array<unsigned_short,_16UL>.elems[8] = local_108._16_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[9] = local_108._18_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_108._20_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_108._24_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_108._28_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_108._30_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0] = local_108._0_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[1] = local_108._2_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_108._4_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_108._8_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_108._12_4_;
      peVar25 = math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::operator<<=
                          ((uintwide_t<256u,unsigned_short,void,true> *)&local_128,uVar27);
      uVar5 = *(undefined8 *)(peVar25->values).super_array<unsigned_short,_16UL>.elems;
      uVar6 = *(undefined8 *)((peVar25->values).super_array<unsigned_short,_16UL>.elems + 4);
      uVar7 = *(undefined8 *)((peVar25->values).super_array<unsigned_short,_16UL>.elems + 8);
      uVar8 = *(undefined8 *)((peVar25->values).super_array<unsigned_short,_16UL>.elems + 0xc);
      local_e8.values.super_array<unsigned_short,_16UL>.elems._0_4_ = SUB84(uVar5,0);
      local_e8.values.super_array<unsigned_short,_16UL>.elems._4_4_ = SUB84((ulong)uVar5 >> 0x20,0);
      local_e8.values.super_array<unsigned_short,_16UL>.elems._8_4_ = SUB84(uVar6,0);
      local_e8.values.super_array<unsigned_short,_16UL>.elems[6] =
           (value_type_conflict3)((ulong)uVar6 >> 0x20);
      local_e8.values.super_array<unsigned_short,_16UL>.elems[7] =
           (value_type_conflict3)((ulong)uVar6 >> 0x30);
      local_e8.values.super_array<unsigned_short,_16UL>.elems[8] = (value_type_conflict3)uVar7;
      local_e8.values.super_array<unsigned_short,_16UL>.elems._18_4_ = SUB84((ulong)uVar7 >> 0x10,0)
      ;
      local_e8.values.super_array<unsigned_short,_16UL>.elems[0xb] =
           (value_type_conflict3)((ulong)uVar7 >> 0x30);
      local_e8.values.super_array<unsigned_short,_16UL>.elems[0xc] = (value_type_conflict3)uVar8;
      local_e8.values.super_array<unsigned_short,_16UL>.elems._26_4_ = SUB84((ulong)uVar8 >> 0x10,0)
      ;
      local_e8.values.super_array<unsigned_short,_16UL>.elems[0xf] =
           (value_type_conflict3)((ulong)uVar8 >> 0x30);
      local_a8 = ZEXT816(0);
      local_b8 = ZEXT816(0);
      local_128.values.super_array<unsigned_short,_16UL>.elems[8] = local_108._16_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[9] = local_108._18_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_108._20_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_108._24_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_108._28_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_108._30_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0] = local_108._0_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[1] = local_108._2_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_108._4_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_108._8_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_108._12_4_;
      peVar25 = math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::operator>>=
                          ((uintwide_t<256u,unsigned_short,void,true> *)&local_128,uVar27);
      local_88 = *(undefined8 *)(peVar25->values).super_array<unsigned_short,_16UL>.elems;
      uStack_80 = *(undefined8 *)((peVar25->values).super_array<unsigned_short,_16UL>.elems + 4);
      local_78 = *(undefined8 *)((peVar25->values).super_array<unsigned_short,_16UL>.elems + 8);
      uStack_70 = *(undefined8 *)((peVar25->values).super_array<unsigned_short,_16UL>.elems + 0xc);
      local_128.values.super_array<unsigned_short,_16UL>.elems[8] = local_108._16_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[9] = local_108._18_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ = local_108._20_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ = local_108._24_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = local_108._28_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = local_108._30_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0] = local_108._0_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[1] = local_108._2_2_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = local_108._4_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ = local_108._8_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ = local_108._12_4_;
      peVar26 = math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::operator>>=
                          ((uintwide_t<256u,unsigned_short,void,true> *)&local_128,uVar27);
      local_68 = *(undefined8 *)(peVar26->values).super_array<unsigned_short,_16UL>.elems;
      uStack_60 = *(undefined8 *)((peVar26->values).super_array<unsigned_short,_16UL>.elems + 4);
      local_58 = *(undefined8 *)((peVar26->values).super_array<unsigned_short,_16UL>.elems + 8);
      uVar5 = *(undefined8 *)((peVar26->values).super_array<unsigned_short,_16UL>.elems + 0xc);
      if (-1 < (short)local_e8.values.super_array<unsigned_short,_16UL>.elems[0xf]) {
        lVar23 = 0x1e;
        do {
          bVar34 = lVar23 == -2;
          if (bVar34) break;
          psVar2 = (short *)((long)local_e8.values.super_array<unsigned_short,_16UL>.elems + lVar23)
          ;
          psVar1 = (short *)((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.
                                   values.super_array<unsigned_short,_16UL>.elems + lVar23);
          lVar23 = lVar23 + -2;
        } while (*psVar2 == *psVar1);
      }
      if ((short)local_a8._14_2_ < 0) {
        bVar35 = false;
      }
      else {
        lVar23 = 0x1e;
        do {
          bVar35 = lVar23 == -2;
          if (bVar35) break;
          psVar2 = (short *)(local_b8 + lVar23);
          psVar1 = (short *)((long)zero_as_small_unsigned_type::local_zero_as_small_unsigned_type.
                                   values.super_array<unsigned_short,_16UL>.elems + lVar23);
          lVar23 = lVar23 + -2;
        } while (*psVar2 == *psVar1);
      }
      local_128.values.super_array<unsigned_short,_16UL>.elems[8] =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems[8];
      vVar13 = local_128.values.super_array<unsigned_short,_16UL>.elems[8];
      local_128.values.super_array<unsigned_short,_16UL>.elems[9] =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems[9];
      vVar14 = local_128.values.super_array<unsigned_short,_16UL>.elems[9];
      local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems.
           _20_4_;
      uVar15 = local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems[0xe];
      vVar17 = local_128.values.super_array<unsigned_short,_16UL>.elems[0xe];
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems[0xf];
      vVar18 = local_128.values.super_array<unsigned_short,_16UL>.elems[0xf];
      local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems.
           _24_4_;
      uVar16 = local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0] =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems[0];
      vVar9 = local_128.values.super_array<unsigned_short,_16UL>.elems[0];
      local_128.values.super_array<unsigned_short,_16UL>.elems[1] =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems[1];
      vVar10 = local_128.values.super_array<unsigned_short,_16UL>.elems[1];
      local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems._4_4_
      ;
      uVar4 = local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems._8_4_
      ;
      uVar11 = local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_;
      local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ =
           local_one_minus_as_small_signed_type.values.super_array<unsigned_short,_16UL>.elems.
           _12_4_;
      uVar12 = local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_;
      if (!eVar21) {
        local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
      }
      if ((short)(local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] ^ uStack_70._6_2_) <
          0) {
        bVar36 = false;
      }
      else {
        lVar23 = 0x1e;
        do {
          bVar36 = lVar23 == -2;
          if (bVar36) break;
          psVar2 = (short *)((long)&local_88 + lVar23);
          psVar1 = (short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23
                            );
          lVar23 = lVar23 + -2;
        } while (*psVar2 == *psVar1);
      }
      local_128.values.super_array<unsigned_short,_16UL>.elems[0] = vVar9;
      local_128.values.super_array<unsigned_short,_16UL>.elems[1] = vVar10;
      local_128.values.super_array<unsigned_short,_16UL>.elems._4_4_ = uVar4;
      local_128.values.super_array<unsigned_short,_16UL>.elems._8_4_ = uVar11;
      local_128.values.super_array<unsigned_short,_16UL>.elems._12_4_ = uVar12;
      local_128.values.super_array<unsigned_short,_16UL>.elems[8] = vVar13;
      local_128.values.super_array<unsigned_short,_16UL>.elems[9] = vVar14;
      local_128.values.super_array<unsigned_short,_16UL>.elems._20_4_ = uVar15;
      local_128.values.super_array<unsigned_short,_16UL>.elems._24_4_ = uVar16;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = vVar17;
      local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = vVar18;
      if (!eVar21) {
        local_128.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
        local_128.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
      }
      uStack_50._6_2_ = (ushort)((ulong)uVar5 >> 0x30);
      if ((short)(local_128.values.super_array<unsigned_short,_16UL>.elems[0xf] ^ uStack_50._6_2_) <
          0) {
        bVar37 = false;
      }
      else {
        lVar23 = 0x1e;
        do {
          bVar37 = lVar23 == -2;
          if (bVar37) break;
          psVar2 = (short *)((long)&local_68 + lVar23);
          in_R8 = lVar23 + -2;
          psVar1 = (short *)((long)local_128.values.super_array<unsigned_short,_16UL>.elems + lVar23
                            );
          lVar23 = in_R8;
        } while (*psVar2 == *psVar1);
      }
      bVar33 = (bool)(bVar33 & bVar34 & bVar35 & bVar36 & bVar37);
      bVar34 = uVar27 < 0x76c;
      uVar27 = uVar27 + 100;
      uStack_50 = uVar5;
    } while (bVar34);
    local_bc = (float)((int)local_bc + 1);
    if (local_bc == 3.58732e-43) {
      return bVar33;
    }
  } while( true );
}

Assistant:

auto test_various_isolated_edge_cases() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  auto result_is_ok = true;

  {
    // See also bug report in legacy project long_long_long
    // https://github.com/ckormanyos/long_long_long/issues/11

    using local_uint64_type = local_uintwide_t_tiny_unsigned_type;
    using local_ctrl64_type = std::uint64_t;

    constexpr std::size_t
      max_size
      {
        static_cast<std::size_t>
        (
          std::numeric_limits<local_uint64_type>::digits / 8
        )
      };

    std::array<std::uint8_t, std::size_t { UINT8_C(16) }>
      buffer
      {
        0x00U, 0x00U, 0x00U, 0x04U, 0x00U, 0x00U, 0x00U, 0xFFU, // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
        0x0FU, 0x00U, 0x00U, 0x00U, 0x00U, 0x03U, 0x00U, 0x00U  // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      };

    local_uint64_type a_uint { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 0U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)
    local_uint64_type b_uint { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 1U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)

    local_ctrl64_type a_ctrl { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 0U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)
    local_ctrl64_type b_ctrl { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 1U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)

    if(a_uint < b_uint)
    {
      std::swap(a_uint, b_uint);
      std::swap(a_ctrl, b_ctrl);
    }

    const local_uint64_type c_uint = a_uint / b_uint;
    const local_ctrl64_type c_ctrl = a_ctrl / b_ctrl;

    const bool
      result_op_is_ok
      {
           (static_cast<std::uint64_t>(c_uint) == c_ctrl)
        && (UINT64_C(0x000000000054FFFF) == c_ctrl)
      };

    result_is_ok = (result_op_is_ok && result_is_ok);
  }

  {
    using local_rep_type   = typename local_uintwide_t_small_unsigned_type::representation_type;
    using local_value_type = typename local_rep_type::value_type;

    local_rep_type
      rep
      (
        local_uintwide_t_small_unsigned_type::number_of_limbs,
        (std::numeric_limits<local_value_type>::max)(),
        typename local_rep_type::allocator_type()
      );

    const auto rep_as_max_is_ok =
      (local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (rep_as_max_is_ok && result_is_ok);

    std::fill(rep.begin(), rep.end(), static_cast<local_value_type>(UINT8_C(0)));

    const auto rep_as_zero_is_ok = (local_uintwide_t_small_unsigned_type(rep) == 0);

    result_is_ok = (rep_as_zero_is_ok && result_is_ok);

    std::fill(rep.begin(), rep.end(), (std::numeric_limits<local_value_type>::max)());

    const auto rep_as_max2_is_ok =
      (local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (rep_as_max2_is_ok && result_is_ok);

    rep =
      local_rep_type
      (
        static_cast<typename local_rep_type::size_type>(rep.size()), // NOLINT(readability-static-accessed-through-instance)
        (std::numeric_limits<local_value_type>::max)(),
        typename local_rep_type::allocator_type()
      );

    const auto rep_as_max3_is_ok =
    (
      local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)()
    );

    result_is_ok = (rep_as_max3_is_ok && result_is_ok);
  }


  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(16));
           ++i)
  {
    eng_flt.seed(util::util_pseudorandom_time_point_seed::value<typename eng_flt_type::result_type>());

    auto dis =
      std::uniform_real_distribution<float>
      {
        static_cast<float>(1.01F), // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
        static_cast<float>(1.04F)  // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      };

    const auto inf_f  = ::local_inf_f () * dis(eng_flt);
    const auto inf_d  = ::local_inf_d () * static_cast<double>(dis(eng_flt));
    const auto inf_ld = ::local_inf_ld() * static_cast<long double>(dis(eng_flt));

    local_uintwide_t_small_unsigned_type u_inf_f (inf_f);
    local_uintwide_t_small_unsigned_type u_inf_d (inf_d);
    local_uintwide_t_small_unsigned_type u_inf_ld(inf_ld);

    const auto result_infinities_is_ok = (   (u_inf_f  == 0)
                                          && (u_inf_d  == 0)
                                          && (u_inf_ld == 0));

    result_is_ok = (result_infinities_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify shift of an unsigned wide-integer by a signed amount.

    const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    const auto ur_neg  = u_gen << static_cast<int>(INT8_C(-4));
    const auto ur_ctrl = u_gen >> static_cast<unsigned>(UINT8_C(4));

    const auto ul_neg  = u_gen >> static_cast<int>(INT8_C(-4));
    const auto ul_ctrl = u_gen << static_cast<unsigned>(UINT8_C(4));

    const auto result_left_is_ok  = (ul_neg == ul_ctrl);
    const auto result_right_is_ok = (ur_neg == ur_ctrl);

    result_is_ok = (result_left_is_ok && result_right_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify shift of a signed wide-integer by a signed amount.

    const auto s_gen = generate_wide_integer_value<local_uintwide_t_small_signed_type>(false);

    const auto sr_neg  = s_gen << static_cast<int>(INT8_C(-4));
    const auto sr_ctrl = s_gen >> static_cast<unsigned>(UINT8_C(4));

    const auto sl_neg  = s_gen >> static_cast<int>(INT8_C(-4));
    const auto sl_ctrl = s_gen << static_cast<unsigned>(UINT8_C(4));

    const auto result_left_is_ok  = (sl_neg == sl_ctrl);
    const auto result_right_is_ok = (sr_neg == sr_ctrl);

    result_is_ok = (result_left_is_ok && result_right_is_ok && result_is_ok);
  }

  {
    local_uintwide_t_small_unsigned_type u1(static_cast<unsigned>(UINT8_C(1)));

    u1 /= zero_as_limb();

    const auto result_overflow_is_ok = (u1 == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_overflow_is_ok && result_is_ok);
  }

  {
    local_uintwide_t_small_unsigned_type u1(static_cast<unsigned>(UINT8_C(1)));

    u1 /= local_uintwide_t_small_unsigned_type(zero_as_limb());

    const auto result_overflow_is_ok = (u1 == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_overflow_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify division of finite, unsigned numerator by zero which returns the maximum of the type.

    auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    u_gen /= zero_as_small_unsigned_type();

    const auto result_unsigned_div_by_zero_is_ok = (u_gen == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_unsigned_div_by_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify division of finite, signed numerator by zero which returns the maximum of the type.

    const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
    auto n_gen = local_uintwide_t_small_signed_type(u_gen);

    n_gen /= local_uintwide_t_small_signed_type(zero_as_small_unsigned_type());

    const auto result_signed_div_by_zero_is_ok = (n_gen == (std::numeric_limits<local_uintwide_t_small_signed_type>::max)());

    result_is_ok = (result_signed_div_by_zero_is_ok && result_is_ok);
  }

  {
    // Verify division of zero by zero which returns the maximum of the type.

    auto z = zero_as_small_unsigned_type();

    z /= zero_as_small_unsigned_type();

    const auto result_zero_div_by_zero_is_ok = (z == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_zero_div_by_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify modulus of zero with a finite denominator which returns zero modulus.

    auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    const auto mod = zero_as_small_unsigned_type() % u_gen;

    const auto result_zero_mod_with_finite_is_ok = (mod == zero_as_small_unsigned_type());

    result_is_ok = (result_zero_mod_with_finite_is_ok && result_is_ok);
  }

  {
    const auto ten_pow_forty = local_uintwide_t_small_unsigned_type("10000000000000000000000000000000000000000");

          auto a(ten_pow_forty);
    const auto b(local_uintwide_t_small_unsigned_type("10000000000000000000000000000000000000000"));

    const auto& c(a %= b);

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wself-assign-overloaded"
    #endif

    const auto& d(a %= a); // NOLINT(clang-diagnostic-self-assign-overloaded)

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic pop
    #endif

    const auto result_self_mod_is_ok = ((c == 0) && (d == 0));

    result_is_ok = (result_self_mod_is_ok && result_is_ok);
  }


  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    auto shift_amount = // NOLINT(altera-id-dependent-backward-branch)
      static_cast<unsigned>
      (
          static_cast<int>
          (
                (std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / static_cast<int>(INT8_C(100)))
            + (((std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits % static_cast<int>(INT8_C(100))) != 0) ? 1 : 0)
          )
        *
          static_cast<int>(INT8_C(100))
      );

    for( ; shift_amount  < static_cast<unsigned>(UINT32_C(2000)); // NOLINT(altera-id-dependent-backward-branch)
           shift_amount += static_cast<unsigned>(UINT32_C(100)))
    {
      const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      auto result_overshift_is_ok = true;

      const auto u_left_n  = local_uintwide_t_small_unsigned_type(u_gen) << static_cast<std::int32_t> (shift_amount);
      const auto u_left_u  = local_uintwide_t_small_unsigned_type(u_gen) << static_cast<std::uint32_t>(shift_amount);
      const auto u_right_n = local_uintwide_t_small_unsigned_type(u_gen) >> static_cast<std::int32_t> (shift_amount);
      const auto u_right_u = local_uintwide_t_small_unsigned_type(u_gen) >> static_cast<std::uint32_t>(shift_amount);

      result_overshift_is_ok = ((u_left_n  == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_left_u  == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_right_n == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_right_u == zero_as_small_unsigned_type()) && result_overshift_is_ok);

      result_is_ok = (result_overshift_is_ok && result_is_ok);
    }
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    auto shift_amount =
      static_cast<unsigned>
      (
          (
                (std::numeric_limits<local_uintwide_t_small_signed_type>::digits / 100)                // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
            + (((std::numeric_limits<local_uintwide_t_small_signed_type>::digits % 100) != 0) ? 1 : 0) // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
          )
        *
          100 // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      );

    for( ; shift_amount  < static_cast<unsigned>(UINT32_C(2000)); // NOLINT(altera-id-dependent-backward-branch)
           shift_amount += static_cast<unsigned>(UINT32_C(100)))
    {
      const auto n_gen = generate_wide_integer_value<local_uintwide_t_small_signed_type>(false);

      const auto n_is_neg = (n_gen < 0);

      const auto n_left_n  = local_uintwide_t_small_signed_type(n_gen) << static_cast<std::int32_t> (shift_amount);
      const auto n_left_u  = local_uintwide_t_small_signed_type(n_gen) << static_cast<std::uint32_t>(shift_amount);
      const auto n_right_n = local_uintwide_t_small_signed_type(n_gen) >> static_cast<std::int32_t> (shift_amount);
      const auto n_right_u = local_uintwide_t_small_signed_type(n_gen) >> static_cast<std::uint32_t>(shift_amount);

      auto result_overshift_is_ok = true;

      result_overshift_is_ok = ((n_left_n  == local_uintwide_t_small_signed_type(zero_as_small_unsigned_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_left_u  == local_uintwide_t_small_signed_type(zero_as_small_unsigned_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_right_n == ((!n_is_neg) ? local_uintwide_t_small_signed_type(zero_as_small_unsigned_type()) : m_one_as_small_signed_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_right_u == ((!n_is_neg) ? local_uintwide_t_small_signed_type(zero_as_small_unsigned_type()) : m_one_as_small_signed_type())) && result_overshift_is_ok);

      result_is_ok = (result_overshift_is_ok && result_is_ok);
    }
  }

  return result_is_ok;
}